

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_function_createPrimitive
          (sysbvm_context_t *context,size_t argumentCount,sysbvm_bitflags_t flags,void *userdata,
          sysbvm_functionEntryPoint_t entryPoint)

{
  sysbvm_object_tuple_t *psVar1;
  ulong uVar2;
  ulong uVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_primitiveTableEntry_t *psVar5;
  bool bVar6;
  
  psVar1 = sysbvm_context_allocatePointerTuple(context,(context->roots).functionType,0xc);
  if (argumentCount + 0x800000000000000 >> 0x3c == 0) {
    sVar4 = argumentCount << 4 | 0xb;
  }
  else {
    sVar4 = sysbvm_tuple_uint64_encodeBig(context,argumentCount);
  }
  psVar1[2].header.field_0.typePointer = sVar4;
  psVar1[1].field_1.pointers[0] = flags << 4 | 0xb;
  psVar1[3].header.identityHashAndFlags = 9;
  psVar1[3].header.objectSize = 0;
  if (userdata == (void *)0x0) {
    if (sysbvm_primitiveTableIsComputed == '\0') {
      sysbvm_primitiveTableIsComputed = '\x01';
      sysbvm_context_registerPrimitives();
    }
    uVar3 = (ulong)sysbvm_primitiveTableSize;
    uVar2 = 0;
    bVar6 = uVar3 != 0;
    if ((bVar6) && (sysbvm_primitiveTable[0].entryPoint != entryPoint)) {
      psVar5 = sysbvm_primitiveTable;
      uVar2 = 0;
      do {
        psVar5 = psVar5 + 1;
        if (uVar3 - 1 == uVar2) {
          bVar6 = uVar2 + 1 < uVar3;
          uVar2 = 0;
          goto LAB_00111bc6;
        }
        uVar2 = uVar2 + 1;
      } while (psVar5->entryPoint != entryPoint);
      bVar6 = uVar2 < uVar3;
    }
LAB_00111bc6:
    if (bVar6) {
      uVar3 = (ulong)((int)uVar2 + 1) << 4 | 9;
      psVar1[3].header.identityHashAndFlags = (int)uVar3;
      psVar1[3].header.objectSize = (int)(uVar3 >> 0x20);
      if (sysbvm_primitiveTable[uVar2 & 0xffffffff].name != (char *)0x0) {
        sVar4 = sysbvm_symbol_internWithCString
                          (context,sysbvm_primitiveTable[uVar2 & 0xffffffff].name);
        psVar1[3].field_1.pointers[0] = sVar4;
      }
    }
  }
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_function_createPrimitive(sysbvm_context_t *context, size_t argumentCount, sysbvm_bitflags_t flags, void *userdata, sysbvm_functionEntryPoint_t entryPoint)
{
    sysbvm_function_t *result = (sysbvm_function_t*)sysbvm_context_allocatePointerTuple(context, context->roots.functionType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_function_t));
    result->argumentCount = sysbvm_tuple_size_encode(context, argumentCount);
    result->flags = sysbvm_tuple_bitflags_encode(flags);
    result->primitiveTableIndex = sysbvm_tuple_uint32_encode(context, 0);
    uint32_t primitiveEntryIndex = 0;
    if(!userdata && sysbvm_primitiveTable_findEntryFor(entryPoint, &primitiveEntryIndex))
    {
        result->primitiveTableIndex = sysbvm_tuple_uint32_encode(context, primitiveEntryIndex + 1);
        const char *primitiveName = sysbvm_primitiveTable[primitiveEntryIndex].name;
        if(primitiveName)
            result->primitiveName = sysbvm_symbol_internWithCString(context, primitiveName);
    }
    return (sysbvm_tuple_t)result;
}